

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeparser.cpp
# Opt level: O3

StateNode * __thiscall
QDateTimeParser::scanString
          (StateNode *__return_storage_ptr__,QDateTimeParser *this,QDateTime *defaultValue,
          bool fixup)

{
  QString *pQVar1;
  long lVar2;
  int *piVar3;
  QDate date_00;
  StateNode *pSVar4;
  QCalendar *this_00;
  int s;
  int m;
  qsizetype qVar5;
  QTimeZone QVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  QFlagsStorage<QDateTimeParser::Section> QVar10;
  FieldInfo FVar11;
  Section SVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  int iVar16;
  time_t tVar17;
  ulong uVar18;
  Data DVar19;
  uint *puVar20;
  SectionNode *pSVar21;
  QDate QVar22;
  time_t *__timer;
  ushort *puVar23;
  bool bVar24;
  undefined7 in_register_00000009;
  char16_t *pcVar25;
  QLocale *locale;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  uint uVar26;
  ulong uVar27;
  QDateTimeParser *__timer_00;
  QDateTime *pQVar28;
  long lVar29;
  State SVar30;
  QtPrivate *this_01;
  char16_t *pcVar31;
  long in_FS_OFFSET;
  SectionNode sn;
  SectionNode sn_00;
  QStringView separator;
  QLatin1StringView needle;
  QStringView rhs;
  QStringView rhs_00;
  QStringView string;
  QStringView separator_00;
  QStringView text;
  QStringView haystack;
  QLatin1StringView lhs;
  QLatin1StringView lhs_00;
  QStringView name;
  QStringView text_00;
  ParsedSection PVar32;
  QFlagsStorage<QDateTimeParser::Section> local_160;
  int hour;
  int local_148;
  State local_144;
  QCalendar *local_140;
  int dayofweek;
  StateNode *local_130;
  int local_124;
  int ampm;
  int msec;
  int second;
  int minute;
  uint local_110;
  int year2digits;
  ulong local_108;
  ulong local_100;
  qsizetype local_f8;
  ulong local_f0;
  undefined4 local_e4;
  long local_e0;
  QString *local_d8;
  ulong local_d0;
  long local_c8;
  QDate local_c0;
  int zoneOffset;
  undefined4 uStack_b4;
  QTime time;
  QDate local_a8;
  QDateTime when;
  QDate date;
  QDateTime usedDateTime;
  QTimeZone timeZone;
  QTime local_54;
  QDate local_50;
  int day;
  int month;
  int year;
  long local_38;
  
  local_e4 = (undefined4)CONCAT71(in_register_00000009,fixup);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_f8 = (this->sectionNodes).d.size;
  year = -0x55555556;
  month = -0x55555556;
  day = -0x55555556;
  __timer_00 = this;
  local_130 = __return_storage_ptr__;
  local_50 = QDateTime::date(defaultValue);
  tVar17 = QDateTime::time(defaultValue,(time_t *)__timer_00);
  local_54.mds = (int)tVar17;
  QDate::getDate(&local_50,&year,&month,&day);
  year2digits = year % 100;
  hour = QTime::hour(&local_54);
  local_110 = 0xffffffff;
  minute = QTime::minute(&local_54);
  second = QTime::second(&local_54);
  msec = QTime::msec(&local_54);
  local_140 = &this->calendar;
  dayofweek = QCalendar::dayOfWeek(local_140,local_50);
  qVar5 = local_f8;
  timeZone.d = (Data)&DAT_aaaaaaaaaaaaaaaa;
  QDateTime::timeRepresentation((QDateTime *)&timeZone);
  ampm = -1;
  if ((int)(uint)qVar5 < 1) {
    local_144 = Acceptable;
    local_160.i = 0;
    iVar13 = 0;
    local_148 = 0;
    bVar24 = false;
  }
  else {
    local_d8 = &this->m_text;
    local_d0 = (ulong)((uint)qVar5 & 0x7fffffff);
    local_144 = Acceptable;
    lVar29 = 0x10;
    local_e0 = 8;
    local_100 = 0;
    bVar24 = false;
    local_148 = 0;
    iVar13 = 0;
    local_160.i = 0;
    do {
      text.m_data = (this->m_text).d.ptr + iVar13;
      pQVar1 = (this->separators).d.ptr;
      text.m_size = (this->m_text).d.size - (long)iVar13;
      separator.m_data = *(storage_type_conflict **)((long)pQVar1 + lVar29 + -8);
      separator.m_size = *(qsizetype *)((long)&(pQVar1->d).d + lVar29);
      local_c8 = lVar29;
      iVar9 = matchesSeparator(text,separator);
      if (iVar9 == -1) goto LAB_0040bf48;
      local_124 = iVar9 + iVar13;
      pSVar21 = (this->sectionNodes).d.ptr;
      *(int *)((long)pSVar21 + local_e0 + -4) = local_124;
      zoneOffset = 0xaaaaaaaa;
      local_108 = (ulong)*(uint *)((long)pSVar21 + local_e0 + -8);
      local_f0 = (ulong)*(uint *)((long)&pSVar21->type + local_e0);
      usedDateTime.d = (Data)&DAT_aaaaaaaaaaaaaaaa;
      local_c0 = actualDate((Sections)local_160.i,(this->calendar).d_ptr,this->defaultCenturyStart,
                            year,year2digits,month,day,dayofweek);
      uVar26 = local_110;
      m = minute;
      s = second;
      iVar15 = msec;
      iVar9 = ampm;
      iVar16 = hour;
      date.jd._0_4_ = -0x55555556;
      QTime::QTime((QTime *)&date,hour,minute,second,msec);
      iVar13 = iVar16 >> 0x1f;
      QVar10.i = local_160.i;
      if (0xc < uVar26) {
        QVar10.i = local_160.i & 0xffffffef;
        uVar26 = iVar16 + (((uint)(iVar16 / 6 + iVar13) >> 1) - iVar13) * -0xc;
      }
      uVar14 = iVar16;
      if ((iVar9 == -1) || ((QVar10.i & 1) == 0)) {
        if (((QVar10.i & 0x10) != 0) &&
           (iVar16 + (((uint)(iVar16 / 6 + iVar13) >> 1) - iVar13) * -0xc != uVar26)) {
          if (((QVar10.i & 0x20) == 0) && (uVar14 = uVar26 + 0xc, iVar16 < 0xd)) {
            uVar14 = uVar26;
          }
          goto LAB_0040b999;
        }
      }
      else {
        iVar9 = iVar9 * 0xc;
        if (iVar16 - uVar26 != iVar9) {
          if (((QVar10.i & 0x20) == 0) && (uVar14 = uVar26 + iVar9, (QVar10.i & 0x10) == 0)) {
            uVar14 = iVar16;
          }
LAB_0040b999:
          QTime::QTime((QTime *)&when,uVar14,m,s,iVar15);
          date.jd._0_4_ = when.d._0_4_;
        }
      }
      QDateTime::QDateTime(&usedDateTime,local_c0,date.jd._0_4_,&timeZone,LegacyBehavior);
      PVar32 = parseSection(this,&usedDateTime,(int)local_100,local_124);
      uVar27 = PVar32._0_8_;
      SVar30 = PVar32.state;
      if (((((char)local_e4 != '\0') && (SVar30 == Intermediate)) && (PVar32.used < (int)local_f0))
         && (FVar11 = fieldInfo(this,(int)local_100),
            (~(uint)FVar11.super_QFlagsStorageHelper<QDateTimeParser::FieldInfoFlag,_4>.
                    super_QFlagsStorage<QDateTimeParser::FieldInfoFlag>.i & 3) == 0)) {
        date.jd._0_4_ = -0x55555556;
        date.jd._4_4_ = 0xaaaaaaaa;
        QString::asprintf((char **)&date,"%0*d",local_f0,uVar27 & 0xffffffff);
        QString::replace(local_d8,(long)local_124,(long)uVar27 >> 0x20,(QString *)&date);
        piVar3 = (int *)CONCAT44(date.jd._4_4_,date.jd._0_4_);
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            QArrayData::deallocate((QArrayData *)CONCAT44(date.jd._4_4_,date.jd._0_4_),2,0x10);
          }
        }
        uVar27 = uVar27 & 0xffffffff | local_f0 << 0x20;
      }
      if ((int)SVar30 <= (int)local_144) {
        local_144 = SVar30;
      }
      if ((local_144 == Invalid) ||
         ((this->context == FromString && ((local_144 == Intermediate || (PVar32.zeroes != 0)))))) {
LAB_0040c836:
        pSVar4 = local_130;
        QDateTime::QDateTime(&local_130->value);
        pSVar4->conflicts = false;
        pSVar4->state = Invalid;
        pSVar4->padded = 0;
        pQVar28 = &usedDateTime;
        goto LAB_0040c857;
      }
      SVar12 = (Section)local_108;
      iVar13 = (int)uVar27;
      if ((int)SVar12 < 0x100) {
        if ((int)SVar12 < 0x10) {
          switch(SVar12) {
          case AmPmSection:
            puVar20 = (uint *)&ampm;
            break;
          case MSecSection:
            puVar20 = (uint *)&msec;
            break;
          default:
switchD_0040bb46_caseD_3:
            date.jd._0_4_ = 2;
            date.jd._4_4_ = 0;
            SectionNode::name((QString *)&when,SVar12);
            puVar23 = QString::utf16((QString *)&when);
            QMessageLogger::warning
                      ((QMessageLogger *)&date,"QDateTimeParser::parse Internal error (%ls)",puVar23
                      );
            scanString();
            goto LAB_0040c836;
          case SecondSection:
            puVar20 = (uint *)&second;
            break;
          case MinuteSection:
            puVar20 = (uint *)&minute;
          }
        }
        else if (SVar12 == Hour12Section) {
          puVar20 = &local_110;
        }
        else if (SVar12 == Hour24Section) {
          puVar20 = (uint *)&hour;
        }
        else {
          if (SVar12 != TimeZoneSection) goto switchD_0040bb46_caseD_3;
          this_01 = (QtPrivate *)(uVar27 >> 0x20);
          iVar9 = (int)(uVar27 >> 0x20);
          if (iVar9 < 1) {
LAB_0040be50:
            puVar20 = (uint *)&zoneOffset;
          }
          else {
            pcVar31 = (this->m_text).d.ptr + local_124;
            needle.m_data = "UTC";
            needle.m_size = 3;
            haystack.m_data = pcVar31;
            haystack.m_size = (qsizetype)this_01;
            bVar7 = QtPrivate::startsWith(haystack,needle,CaseSensitive);
            pcVar25 = pcVar31;
            if (bVar7) {
              if (iVar9 != 3) {
                pcVar25 = pcVar31 + 3;
                goto LAB_0040bc9b;
              }
              bVar7 = false;
LAB_0040bcda:
              rhs_00.m_data = pcVar31;
              rhs_00.m_size = 3;
              lhs_00.m_data = "UTC";
              lhs_00.m_size = 3;
              bVar8 = QtPrivate::equalStrings(lhs_00,rhs_00);
LAB_0040bcf3:
              if ((!bVar7) && (bVar8 == false)) {
                (*this->_vptr_QDateTimeParser[6])(&date,this);
                locale = (QLocale *)&date;
                name.m_data = pcVar31;
                name.m_size = (qsizetype)this_01;
                iVar13 = startsWithLocalTimeZone(name,&usedDateTime,locale);
                QLocale::~QLocale((QLocale *)&date);
                QVar6 = timeZone;
                if (iVar13 == iVar9) {
                  timeZone.d = (Data)(ShortData)0x1;
                  date.jd._0_4_ = QVar6.d._0_4_;
                  date.jd._4_4_ = QVar6.d._4_4_;
                  pQVar28 = (QDateTime *)&date;
                }
                else {
                  when.d = (Data)&DAT_aaaaaaaaaaaaaaaa;
                  string.m_data = (storage_type_conflict *)locale;
                  string.m_size = (qsizetype)pcVar31;
                  QtPrivate::convertToLatin1((QByteArray *)&date,this_01,string);
                  pQVar28 = &when;
                  QTimeZone::QTimeZone((QTimeZone *)pQVar28,(QByteArray *)&date);
                  piVar3 = (int *)CONCAT44(date.jd._4_4_,date.jd._0_4_);
                  if (piVar3 != (int *)0x0) {
                    LOCK();
                    *piVar3 = *piVar3 + -1;
                    UNLOCK();
                    if (*piVar3 == 0) {
                      QArrayData::deallocate
                                ((QArrayData *)CONCAT44(date.jd._4_4_,date.jd._0_4_),1,0x10);
                    }
                  }
                  QTimeZone::operator=(&timeZone,(QTimeZone *)pQVar28);
                }
                QTimeZone::~QTimeZone((QTimeZone *)pQVar28);
                goto LAB_0040be50;
              }
            }
            else {
LAB_0040bc9b:
              bVar7 = (*pcVar25 + L'ￕ' & 0xfffdU) == 0;
              if (iVar9 == 3) goto LAB_0040bcda;
              if ((iVar9 != 1) ||
                 (rhs.m_data = pcVar31, rhs.m_size = 1, lhs.m_data = "Z", lhs.m_size = 1,
                 bVar8 = QtPrivate::equalStrings(lhs,rhs), !bVar8)) {
                bVar8 = false;
                goto LAB_0040bcf3;
              }
            }
            DVar19.d = (QTimeZonePrivate *)((3 - (ulong)(iVar13 == 0)) + (long)iVar13 * 4);
            if (0x1c200 < (long)iVar13 + 0xe100U) {
              DVar19.d = (QTimeZonePrivate *)0x0;
            }
            date.jd._0_4_ = timeZone.d._0_4_;
            date.jd._4_4_ = timeZone.d._4_4_;
            timeZone.d = DVar19;
            QTimeZone::~QTimeZone((QTimeZone *)&date);
            puVar20 = (uint *)&zoneOffset;
          }
        }
      }
      else if ((int)SVar12 < 0x800) {
        if (SVar12 == DaySection) {
          uVar18 = 1;
          if (1 < iVar13) {
            uVar18 = uVar27 & 0xffffffff;
          }
          uVar27 = uVar27 & 0xffffffff00000000 | uVar18;
          puVar20 = (uint *)&day;
        }
        else if (SVar12 == MonthSection) {
          puVar20 = (uint *)&month;
        }
        else {
          if (SVar12 != YearSection) goto switchD_0040bb46_caseD_3;
          puVar20 = (uint *)&year;
        }
      }
      else if (SVar12 == YearSection2Digits) {
        puVar20 = (uint *)&year2digits;
      }
      else {
        if ((SVar12 != DayOfWeekSectionShort) && (SVar12 != DayOfWeekSectionLong))
        goto switchD_0040bb46_caseD_3;
        puVar20 = (uint *)&dayofweek;
      }
      iVar13 = (int)(uVar27 >> 0x20);
      if (iVar13 == 0 || (long)uVar27 < 0) {
        iVar13 = 0;
      }
      if ((((local_160.i & (uint)local_108) == 0) || (*puVar20 == (uint)uVar27)) ||
         (bVar24 = true, local_100 == (uint)this->currentSectionIndex)) {
        *puVar20 = (uint)uVar27;
        local_160.i = local_160.i | (uint)local_108;
      }
      local_148 = local_148 + PVar32.zeroes;
      iVar13 = iVar13 + local_124;
      QDateTime::~QDateTime(&usedDateTime);
      local_100 = local_100 + 1;
      lVar29 = local_c8 + 0x18;
      local_e0 = local_e0 + 0x10;
    } while (local_d0 != local_100);
  }
  lVar29 = (this->m_text).d.size;
  pQVar1 = (this->separators).d.ptr;
  text_00.m_data = (this->m_text).d.ptr + iVar13;
  text_00.m_size = lVar29 - iVar13;
  lVar2 = (this->separators).d.size;
  separator_00.m_data = pQVar1[lVar2 + -1].d.ptr;
  separator_00.m_size = pQVar1[lVar2 + -1].d.size;
  iVar9 = matchesSeparator(text_00,separator_00);
  SVar30 = local_144;
  if ((iVar9 == -1) || (iVar9 + iVar13 < lVar29)) {
LAB_0040bf48:
    pSVar4 = local_130;
    QDateTime::QDateTime(&local_130->value);
    pSVar4->conflicts = false;
    pSVar4->state = Invalid;
    pSVar4->padded = 0;
    goto LAB_0040c85c;
  }
  if (this->parserType == QTime) {
LAB_0040c44f:
    iVar13 = hour;
    bVar7 = bVar24;
    if ((local_160.i & 0x10) == 0) {
      if (ampm != -1) {
        if ((local_160.i & 0x20) == 0) {
          iVar13 = ampm * 0xc;
        }
        else {
          bVar7 = true;
          if (0xb < hour != (ampm == 0)) {
            bVar7 = bVar24;
          }
        }
      }
    }
    else {
      uVar14 = local_160.i >> 5 & 1;
      uVar26 = (uint)(0xb < hour & (byte)uVar14);
      if (ampm != -1) {
        uVar26 = ampm;
      }
      iVar9 = local_110 +
              (((uint)((int)local_110 / 6 + ((int)local_110 >> 0x1f)) >> 1) -
              ((int)local_110 >> 0x1f)) * -0xc + uVar26 * 0xc;
      iVar13 = iVar9;
      if ((uVar14 != 0) && (iVar13 = hour, bVar7 = true, hour == iVar9)) {
        bVar7 = bVar24;
      }
    }
  }
  else {
    if ((year % 100 != year2digits) && ((local_160.i & 0x800) != 0)) {
      date.jd._0_4_ = 0xaaaaaaaa;
      date.jd._4_4_ = 0xaaaaaaaa;
      QVar22 = actualDate((Sections)local_160.i,(this->calendar).d_ptr,this->defaultCenturyStart,
                          year,year2digits,month,day,dayofweek);
      date.jd._0_4_ = (int)QVar22.jd;
      date.jd._4_4_ = (undefined4)((ulong)QVar22.jd >> 0x20);
      if (QVar22.jd + 0xb69eeff91fU < 0x16d3e147974) {
        if ((local_160.i >> 10 & 1) == 0) {
          year = QDate::year(&date);
        }
        else {
          pSVar21 = sectionNode(this,this->currentSectionIndex);
          bVar24 = true;
          if (pSVar21->type == YearSection2Digits) {
            year = QDate::year(&date);
          }
        }
      }
      else {
        SVar30 = Invalid;
      }
    }
    pSVar21 = sectionNode(this,this->currentSectionIndex);
    SVar12 = pSVar21->type;
    when.d = (Data)&DAT_aaaaaaaaaaaaaaaa;
    QDate::QDate((QDate *)&when,year,month,day,local_140->d_ptr);
    iVar13 = dayofweek;
    if ((long)when.d + 0xb69eeff91fU < 0x16d3e147974) {
      iVar9 = QCalendar::dayOfWeek(local_140,(QDate)when.d);
      if ((SVar30 == Acceptable) && (iVar13 != iVar9)) {
LAB_0040c102:
        if ((local_160.i & 0x3000) != 0) {
          bVar7 = true;
          if ((local_160.i >> 8 & 1) == 0) {
            bVar7 = bVar24;
          }
          bVar24 = bVar7;
          if (((this->currentSectionIndex == -1) || ((SVar12 & DayOfWeekSectionMask) != NoSection))
             || ((!bVar7 && ((SVar12 & (YearSectionMask|MonthSection)) != NoSection)))) {
            day = weekDayWithinMonth(local_140->d_ptr,year,month,day,dayofweek);
          }
        }
      }
    }
    else if (SVar30 == Acceptable) goto LAB_0040c102;
    if ((SVar12 & DaySectionMask) == NoSection) {
      if ((day < this->cachedDay) && (((local_160.i & 0x3000) == 0 || (SVar30 != Acceptable)))) {
        bVar7 = true;
        day = this->cachedDay;
      }
      else {
        bVar7 = false;
      }
    }
    else {
      this->cachedDay = day;
      bVar7 = false;
    }
    bVar8 = QCalendar::isDateValid(local_140,year,month,day);
    iVar13 = day;
    if (bVar8) {
LAB_0040c230:
      if (bVar7) {
LAB_0040c238:
        if (this->context == FromString) goto LAB_0040bf48;
        if (SVar30 == Acceptable) {
          if (this->fixday == true) {
            iVar13 = QCalendar::daysInMonth(local_140,month,year);
            if (day < iVar13) {
              iVar13 = day;
            }
            usedDateTime.d = (Data)&DAT_aaaaaaaaaaaaaaaa;
            day = iVar13;
            (*this->_vptr_QDateTimeParser[6])(&usedDateTime,this);
            if (0 < (int)local_f8) {
              iVar13 = 0;
              do {
                pSVar21 = sectionNode(this,iVar13);
                this_00 = local_140;
                uVar27._0_4_ = pSVar21->type;
                uVar27._4_4_ = pSVar21->pos;
                if (((uint)(undefined4)uVar27 >> 8 & 1) == 0) {
                  if ((uVar27 & 0x3000) != 0) {
                    QDate::QDate(&local_a8,year,month,day,local_140->d_ptr);
                    iVar9 = QCalendar::dayOfWeek(this_00,local_a8);
                    date.jd._0_4_ = -0x55555556;
                    date.jd._4_4_ = 0xaaaaaaaa;
                    QLocale::dayName((QString *)&date,(QLocale *)&usedDateTime,iVar9,
                                     (uint)((undefined4)uVar27 == 0x1000));
                    sn.count = (int)extraout_RDX_00;
                    sn.zeroesAdded = (int)((ulong)extraout_RDX_00 >> 0x20);
                    sn.type = (undefined4)uVar27;
                    sn.pos = uVar27._4_4_;
                    iVar9 = sectionPos(this,sn);
                    iVar16 = sectionSize(this,iVar13);
                    QString::replace(&this->m_text,(long)iVar9,(long)iVar16,(QString *)&date);
                    goto LAB_0040c3dd;
                  }
                }
                else {
                  sn_00.count = (int)extraout_RDX;
                  sn_00.zeroesAdded = (int)((ulong)extraout_RDX >> 0x20);
                  sn_00.type = (undefined4)uVar27;
                  sn_00.pos = uVar27._4_4_;
                  iVar9 = sectionPos(this,sn_00);
                  iVar16 = sectionSize(this,iVar13);
                  QLocale::toString((QString *)&date,(QLocale *)&usedDateTime,(long)day);
                  QString::replace(&this->m_text,(long)iVar9,(long)iVar16,(QString *)&date);
LAB_0040c3dd:
                  piVar3 = (int *)CONCAT44(date.jd._4_4_,date.jd._0_4_);
                  if (piVar3 != (int *)0x0) {
                    LOCK();
                    *piVar3 = *piVar3 + -1;
                    UNLOCK();
                    if (*piVar3 == 0) {
                      QArrayData::deallocate
                                ((QArrayData *)CONCAT44(date.jd._4_4_,date.jd._0_4_),2,0x10);
                    }
                  }
                }
                iVar13 = iVar13 + 1;
              } while ((int)local_f8 != iVar13);
            }
            QLocale::~QLocale((QLocale *)&usedDateTime);
            SVar30 = Acceptable;
          }
          else {
LAB_0040c433:
            SVar30 = Intermediate;
          }
        }
        else if (1 < (int)SVar30) goto LAB_0040c433;
      }
    }
    else {
      iVar16 = QCalendar::maximumDaysInMonth(local_140);
      iVar9 = day;
      if (iVar13 <= iVar16) {
        this->cachedDay = day;
      }
      iVar13 = QCalendar::minimumDaysInMonth(local_140);
      if (iVar9 <= iVar13) goto LAB_0040c230;
      bVar8 = QCalendar::isDateValid(local_140,year,month,1);
      if (bVar8 || bVar7) goto LAB_0040c238;
    }
    iVar13 = hour;
    bVar7 = bVar24;
    if (this->parserType != QDate) goto LAB_0040c44f;
  }
  hour = iVar13;
  date.jd._0_4_ = -0x55555556;
  date.jd._4_4_ = 0xaaaaaaaa;
  QDate::QDate(&date,year,month,day,local_140->d_ptr);
  iVar16 = minute;
  iVar9 = second;
  iVar13 = msec;
  time.mds = -0x55555556;
  QTime::QTime(&time,hour,minute,second,msec);
  when.d = (Data)&DAT_aaaaaaaaaaaaaaaa;
  QVar22.jd._4_4_ = date.jd._4_4_;
  QVar22.jd._0_4_ = date.jd._0_4_;
  QDateTime::QDateTime(&when,QVar22,time,&timeZone,LegacyBehavior);
  tVar17 = QDateTime::time(&when,(time_t *)QVar22.jd);
  if (((int)tVar17 == time.mds) &&
     (QVar22 = QDateTime::date(&when), QVar22.jd == CONCAT44(date.jd._4_4_,date.jd._0_4_))) {
LAB_0040c5cd:
    pSVar4 = local_130;
    QDateTime::QDateTime(&local_130->value,&when);
    pSVar4->state = SVar30;
    pSVar4->padded = local_148;
    pSVar4->conflicts = bVar7;
  }
  else {
    if ((local_160.i & 0x30) != 0) {
      if (0 < (int)SVar30) {
        SVar30 = Intermediate;
      }
      goto LAB_0040c5cd;
    }
    if (this->parserType == QDate) {
      _zoneOffset = (Data)0x2;
      QDate::startOfDay((QDate *)&usedDateTime,(QTimeZone *)&date);
LAB_0040c676:
      pSVar4 = local_130;
      QDateTime::QDateTime(&local_130->value,&usedDateTime);
      pSVar4->state = SVar30;
      pSVar4->padded = local_148;
      pSVar4->conflicts = bVar7;
      QDateTime::~QDateTime(&usedDateTime);
      QTimeZone::~QTimeZone((QTimeZone *)&zoneOffset);
    }
    else {
      if (this->parserType == QTime) {
        date_00.jd._4_4_ = date.jd._4_4_;
        date_00.jd._0_4_ = date.jd._0_4_;
        _zoneOffset = (Data)0x2;
        QDateTime::QDateTime(&usedDateTime,date_00,time,(QTimeZone *)&zoneOffset,LegacyBehavior);
        goto LAB_0040c676;
      }
      __timer = (time_t *)QDateTime::toMSecsSinceEpoch(&when);
      usedDateTime.d = (Data)&DAT_aaaaaaaaaaaaaaaa;
      QDateTime::fromMSecsSinceEpoch(&usedDateTime,(qint64)__timer,&timeZone);
      tVar17 = QDateTime::time(&usedDateTime,__timer);
      zoneOffset = (int)tVar17;
      QVar22 = QDateTime::date(&usedDateTime);
      if ((((QVar22.jd != CONCAT44(date.jd._4_4_,date.jd._0_4_)) ||
           (((local_160.i & 8) != 0 &&
            (iVar15 = QTime::minute((QTime *)&zoneOffset), iVar15 != iVar16)))) ||
          (((local_160.i & 4) != 0 &&
           (iVar16 = QTime::second((QTime *)&zoneOffset), iVar16 != iVar9)))) ||
         (((local_160.i & 2) != 0 && (iVar9 = QTime::msec((QTime *)&zoneOffset), iVar9 != iVar13))))
      {
        QDateTime::~QDateTime(&usedDateTime);
        goto LAB_0040c5cd;
      }
      pSVar4 = local_130;
      QDateTime::QDateTime(&local_130->value,&usedDateTime);
      pSVar4->state = SVar30;
      pSVar4->padded = local_148;
      pSVar4->conflicts = bVar7;
      QDateTime::~QDateTime(&usedDateTime);
    }
  }
  pQVar28 = &when;
LAB_0040c857:
  QDateTime::~QDateTime(pQVar28);
LAB_0040c85c:
  QTimeZone::~QTimeZone(&timeZone);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return local_130;
  }
  __stack_chk_fail();
}

Assistant:

QDateTimeParser::StateNode
QDateTimeParser::scanString(const QDateTime &defaultValue, bool fixup) const
{
    State state = Acceptable;
    bool conflicts = false;
    const int sectionNodesCount = sectionNodes.size();
    int padding = 0;
    int pos = 0;
    int year, month, day;
    const QDate defaultDate = defaultValue.date();
    const QTime defaultTime = defaultValue.time();
    defaultDate.getDate(&year, &month, &day);
    int year2digits = year % 100;
    int hour = defaultTime.hour();
    int hour12 = -1;
    int minute = defaultTime.minute();
    int second = defaultTime.second();
    int msec = defaultTime.msec();
    int dayofweek = calendar.dayOfWeek(defaultDate);
    QTimeZone timeZone = defaultValue.timeRepresentation();

    int ampm = -1;
    Sections isSet = NoSection;

    for (int index = 0; index < sectionNodesCount; ++index) {
        Q_ASSERT(state != Invalid);
        const QString &separator = separators.at(index);
        int step = matchesSeparator(QStringView{m_text}.sliced(pos), separator);
        if (step == -1) {
            QDTPDEBUG << "invalid because" << QStringView{m_text}.sliced(pos)
                      << "does not start with" << separator
                      << index << pos << currentSectionIndex;
            return StateNode();
        }
        pos += step;
        sectionNodes[index].pos = pos;
        int *current = nullptr;
        int zoneOffset; // Needed to serve as *current when setting zone
        const SectionNode sn = sectionNodes.at(index);
        const QDateTime usedDateTime = [&] {
            const QDate date = actualDate(isSet, calendar, defaultCenturyStart,
                                          year, year2digits, month, day, dayofweek);
            const QTime time = actualTime(isSet, hour, hour12, ampm, minute, second, msec);
            return QDateTime(date, time, timeZone);
        }();
        ParsedSection sect = parseSection(usedDateTime, index, pos);

        QDTPDEBUG << "sectionValue" << sn.name() << m_text
                  << "pos" << pos << "used" << sect.used << stateName(sect.state);

        padding += sect.zeroes;
        if (fixup && sect.state == Intermediate && sect.used < sn.count) {
            const FieldInfo fi = fieldInfo(index);
            if ((fi & (Numeric|FixedWidth)) == (Numeric|FixedWidth)) {
                const QString newText = QString::asprintf("%0*d", sn.count, sect.value);
                m_text.replace(pos, sect.used, newText);
                sect.used = sn.count;
            }
        }

        state = qMin<State>(state, sect.state);
        // QDateTimeEdit can fix Intermediate and zeroes, but input needing that didn't match format:
        if (state == Invalid || (context == FromString && (state == Intermediate || sect.zeroes)))
            return StateNode();

        switch (sn.type) {
        case TimeZoneSection:
            current = &zoneOffset;
            if (sect.used > 0) {
                // Synchronize with what findTimeZone() found:
                QStringView zoneName = QStringView{m_text}.sliced(pos, sect.used);
                Q_ASSERT(!zoneName.isEmpty()); // sect.used > 0

                const QStringView offsetStr
                    = zoneName.startsWith("UTC"_L1) ? zoneName.sliced(3) : zoneName;
                const bool isUtcOffset = offsetStr.startsWith(u'+') || offsetStr.startsWith(u'-');
                const bool isUtc = zoneName == "Z"_L1 || zoneName == "UTC"_L1;

                if (isUtc || isUtcOffset) {
                    timeZone = QTimeZone::fromSecondsAheadOfUtc(sect.value);
#if QT_CONFIG(timezone)
                } else if (startsWithLocalTimeZone(zoneName, usedDateTime, locale()) != sect.used) {
                    QTimeZone namedZone = QTimeZone(zoneName.toLatin1());
                    Q_ASSERT(namedZone.isValid());
                    timeZone = namedZone;
#endif
                } else {
                    timeZone = QTimeZone::LocalTime;
                }
            }
            break;
        case Hour24Section: current = &hour; break;
        case Hour12Section: current = &hour12; break;
        case MinuteSection: current = &minute; break;
        case SecondSection: current = &second; break;
        case MSecSection: current = &msec; break;
        case YearSection: current = &year; break;
        case YearSection2Digits: current = &year2digits; break;
        case MonthSection: current = &month; break;
        case DayOfWeekSectionShort:
        case DayOfWeekSectionLong: current = &dayofweek; break;
        case DaySection: current = &day; sect.value = qMax<int>(1, sect.value); break;
        case AmPmSection: current = &ampm; break;
        default:
            qWarning("QDateTimeParser::parse Internal error (%ls)",
                     qUtf16Printable(sn.name()));
            return StateNode();
        }
        Q_ASSERT(current);
        Q_ASSERT(sect.state != Invalid);

        if (sect.used > 0)
            pos += sect.used;
        QDTPDEBUG << index << sn.name() << "is set to"
                  << pos << "state is" << stateName(state);

        if (isSet & sn.type && *current != sect.value) {
            QDTPDEBUG << "CONFLICT " << sn.name() << *current << sect.value;
            conflicts = true;
            if (index != currentSectionIndex)
                continue;
        }
        *current = sect.value;

        // Record the present section:
        isSet |= sn.type;
    }

    int step = matchesSeparator(QStringView{m_text}.sliced(pos), separators.last());
    if (step == -1 || step + pos < m_text.size()) {
        QDTPDEBUG << "invalid because" << QStringView{m_text}.sliced(pos)
                  << "does not match" << separators.last() << pos;
        return StateNode();
    }

    if (parserType != QMetaType::QTime) {
        if (year % 100 != year2digits && (isSet & YearSection2Digits)) {
            const QDate date = actualDate(isSet, calendar, defaultCenturyStart,
                                          year, year2digits, month, day, dayofweek);
            if (!date.isValid()) {
                state = Invalid;
            } else if (!(isSet & YearSection)) {
                year = date.year();
            } else {
                conflicts = true;
                const SectionNode &sn = sectionNode(currentSectionIndex);
                if (sn.type == YearSection2Digits)
                    year = date.year();
            }
        }

        const auto fieldType = sectionType(currentSectionIndex);
        const QDate date(year, month, day, calendar);
        if ((!date.isValid() || dayofweek != calendar.dayOfWeek(date))
                && state == Acceptable && isSet & DayOfWeekSectionMask) {
            if (isSet & DaySection)
                conflicts = true;
            // Change to day of week should adjust day of month;
            // when day of month isn't set, so should change to year or month.
            if (currentSectionIndex == -1 || fieldType & DayOfWeekSectionMask
                    || (!conflicts && (fieldType & (YearSectionMask | MonthSection)))) {
                day = weekDayWithinMonth(calendar, year, month, day, dayofweek);
                QDTPDEBUG << year << month << day << dayofweek
                          << calendar.dayOfWeek(QDate(year, month, day, calendar));
            }
        }

        bool needfixday = false;
        if (fieldType & DaySectionMask) {
            cachedDay = day;
        } else if (cachedDay > day && !(isSet & DayOfWeekSectionMask && state == Acceptable)) {
            day = cachedDay;
            needfixday = true;
        }

        if (!calendar.isDateValid(year, month, day)) {
            if (day <= calendar.maximumDaysInMonth())
                cachedDay = day;
            if (day > calendar.minimumDaysInMonth() && calendar.isDateValid(year, month, 1))
                needfixday = true;
        }
        if (needfixday) {
            if (context == FromString)
                return StateNode();
            if (state == Acceptable && fixday) {
                day = qMin<int>(day, calendar.daysInMonth(month, year));

                const QLocale loc = locale();
                for (int i=0; i<sectionNodesCount; ++i) {
                    const SectionNode sn = sectionNode(i);
                    if (sn.type & DaySection) {
                        m_text.replace(sectionPos(sn), sectionSize(i), loc.toString(day));
                    } else if (sn.type & DayOfWeekSectionMask) {
                        const int dayOfWeek = calendar.dayOfWeek(QDate(year, month, day, calendar));
                        const QLocale::FormatType dayFormat =
                            (sn.type == DayOfWeekSectionShort
                             ? QLocale::ShortFormat : QLocale::LongFormat);
                        const QString dayName(loc.dayName(dayOfWeek, dayFormat));
                        m_text.replace(sectionPos(sn), sectionSize(i), dayName);
                    }
                }
            } else if (state > Intermediate) {
                state = Intermediate;
            }
        }
    }

    if (parserType != QMetaType::QDate) {
        if (isSet & Hour12Section) {
            const bool hasHour = isSet.testAnyFlag(Hour24Section);
            if (ampm == -1) // If we don't know from hour, assume am:
                ampm = !hasHour || hour < 12 ? 0 : 1;
            hour12 = hour12 % 12 + ampm * 12;
            if (!hasHour)
                hour = hour12;
            else if (hour != hour12)
                conflicts = true;
        } else if (ampm != -1) {
            if (!(isSet & (Hour24Section)))
                hour = 12 * ampm; // Special case: only ap section
            else if ((ampm == 0) != (hour < 12))
                conflicts = true;
        }
    }

    QDTPDEBUG << year << month << day << hour << minute << second << msec;
    Q_ASSERT(state != Invalid);

    const QDate date(year, month, day, calendar);
    const QTime time(hour, minute, second, msec);
    const QDateTime when = QDateTime(date, time, timeZone);

    if (when.time() != time || when.date() != date) {
        // In a spring-forward, if we hit the skipped hour, we may have been
        // shunted out of it.

        // If hour wasn't specified, so we're using our default, changing it may
        // fix that.
        if (!(isSet & HourSectionMask)) {
            switch (parserType) {
            case QMetaType::QDateTime: {
                qint64 msecs = when.toMSecsSinceEpoch();
                // Fortunately, that gets a useful answer, even though when is invalid ...
                const QDateTime replace = QDateTime::fromMSecsSinceEpoch(msecs, timeZone);
                const QTime tick = replace.time();
                if (replace.date() == date
                    && (!(isSet & MinuteSection) || tick.minute() == minute)
                    && (!(isSet & SecondSection) || tick.second() == second)
                    && (!(isSet & MSecSection)   || tick.msec() == msec)) {
                    return StateNode(replace, state, padding, conflicts);
                }
            } break;
            case QMetaType::QDate:
                // Don't care about time, so just use start of day (and ignore spec):
                return StateNode(date.startOfDay(QTimeZone::UTC),
                                 state, padding, conflicts);
                break;
            case QMetaType::QTime:
                // Don't care about date or representation, so pick a safe representation:
                return StateNode(QDateTime(date, time, QTimeZone::UTC),
                                 state, padding, conflicts);
            default:
                Q_UNREACHABLE_RETURN(StateNode());
            }
        } else if (state > Intermediate) {
            state = Intermediate;
        }
    }

    return StateNode(when, state, padding, conflicts);
}